

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseOptGroup(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  int iVar1;
  TidyTagId TVar2;
  Lexer *pLVar3;
  Node *pNVar4;
  Bool BVar5;
  Node *node;
  Node **ppNVar6;
  
  pLVar3 = doc->lexer;
  if (field == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    if ((long)iVar1 < 0) {
      field = (Node *)0x0;
    }
    else {
      field = (doc->stack).content[iVar1].original_node;
      (doc->stack).top = iVar1 + -1;
    }
  }
  pLVar3->insert = (IStack *)0x0;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  do {
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    if ((node->tag == field->tag) && (node->type == EndTag)) {
      prvTidyFreeNode(doc,node);
      field->closed = yes;
      TrimSpaces(doc,field);
      return (Node *)0x0;
    }
    BVar5 = InsertMisc(field,node);
    if (BVar5 == no) {
      if ((node->type == StartTag) && (node->tag != (Dict *)0x0)) {
        TVar2 = node->tag->id;
        if (TVar2 == TidyTag_OPTGROUP) {
          prvTidyReport(doc,field,node,0x231);
LAB_0013c51b:
          node->parent = field;
          pNVar4 = field->last;
          node->prev = pNVar4;
          ppNVar6 = &pNVar4->next;
          if (pNVar4 == (Node *)0x0) {
            ppNVar6 = &field->content;
          }
          *ppNVar6 = node;
          field->last = node;
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT2448(CONCAT816(node,CONCAT88(field,prvTidyParseOptGroup))));
          return node;
        }
        if (TVar2 == TidyTag_OPTION) goto LAB_0013c51b;
      }
      prvTidyReport(doc,field,node,0x235);
      prvTidyFreeNode(doc,node);
    }
    node = prvTidyGetToken(doc,IgnoreWhitespace);
  } while( true );
}

Assistant:

Node* TY_(ParseOptGroup)( TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;
    
    if ( field == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        field = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(field);
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag &&
             (nodeIsOPTION(node) || nodeIsOPTGROUP(node)) )
        {
            TidyParserMemory memory = {0};

            if ( nodeIsOPTGROUP(node) )
                TY_(Report)(doc, field, node, CANT_BE_NESTED);

            TY_(InsertNodeAtEnd)(field, node);

            memory.identity = TY_(ParseOptGroup);
            memory.original_node = field;
            memory.reentry_node = node;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}